

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string *message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  string *__lhs;
  char *pcVar1;
  lock_guard<std::mutex> local_158;
  lock_guard<std::mutex> lock;
  string local_148;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  undefined1 local_50 [8];
  string msg;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  string *message_local;
  GenT genType_local;
  Logger *this_local;
  
  msg.field_2._8_8_ = output;
  std::__cxx11::string::string((string *)local_50);
  std::__cxx11::string::push_back((char)(string *)local_50);
  __lhs = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  std::operator+(&local_a0,__lhs," subprocess error");
  HeadLine(&local_80,&local_a0);
  std::__cxx11::string::operator+=((string *)local_50,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::operator+=((string *)local_50,(string *)message);
  pcVar1 = (char *)std::__cxx11::string::back();
  if (*pcVar1 != '\n') {
    std::__cxx11::string::push_back((char)local_50);
  }
  std::__cxx11::string::push_back((char)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Command",&local_e1);
  HeadLine(&local_c0,&local_e0);
  std::__cxx11::string::operator+=((string *)local_50,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  cmQtAutoGen::QuotedCommand(&local_108,command);
  std::__cxx11::string::operator+=((string *)local_50,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar1 = (char *)std::__cxx11::string::back();
  if (*pcVar1 != '\n') {
    std::__cxx11::string::push_back((char)local_50);
  }
  std::__cxx11::string::push_back((char)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Output",(allocator<char> *)((long)&lock._M_device + 7));
  HeadLine(&local_128,&local_148);
  std::__cxx11::string::operator+=((string *)local_50,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lock._M_device + 7));
  std::__cxx11::string::operator+=((string *)local_50,(string *)msg.field_2._8_8_);
  pcVar1 = (char *)std::__cxx11::string::back();
  if (*pcVar1 != '\n') {
    std::__cxx11::string::push_back((char)local_50);
  }
  std::__cxx11::string::push_back((char)local_50);
  std::lock_guard<std::mutex>::lock_guard(&local_158,&this->Mutex_);
  cmSystemTools::Stderr((string *)local_50);
  std::lock_guard<std::mutex>::~lock_guard(&local_158);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, std::string const& message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg;
  msg.push_back('\n');
  msg += HeadLine(GeneratorName(genType) + " subprocess error");
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  msg += HeadLine("Command");
  msg += QuotedCommand(command);
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  msg += HeadLine("Output");
  msg += output;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stderr(msg);
  }
}